

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O2

void __thiscall
JPolComponent_VectorImplementation::ExportPolicyToFile
          (JPolComponent_VectorImplementation *this,string *path,Index *horizon)

{
  PolicyPureVector *pPVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  int iVar5;
  Index i;
  Interface_ProblemToPolicyDiscretePure *pIVar6;
  ulong uVar7;
  allocator_type local_251;
  ulong local_250;
  vector<unsigned_int,_std::allocator<unsigned_int>_> numObvsHistory;
  ofstream fp;
  
  std::ofstream::ofstream((ostream *)&fp,(path->_M_dataplus)._M_p,_S_out);
  poVar4 = std::operator<<((ostream *)&fp,"Horizon : ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  pIVar6 = this->_m_PTPDP;
  if (pIVar6 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
    pIVar6 = (this->_m_PTPDPshared).px;
  }
  uVar2 = (*(pIVar6->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  poVar4 = std::operator<<((ostream *)&fp,"NrAgents : ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&numObvsHistory,(ulong)uVar2,&local_251);
  for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
    pIVar6 = this->_m_PTPDP;
    if (pIVar6 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
      pIVar6 = (this->_m_PTPDPshared).px;
    }
    uVar3 = (*(pIVar6->super_Interface_ProblemToPolicyDiscrete).
              _vptr_Interface_ProblemToPolicyDiscrete[5])
                      (pIVar6,uVar7 & 0xffffffff,1,
                       ((this->_m_indivPols_PolicyPureVector).
                        super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar7]->super_PolicyDiscretePure).
                       super_PolicyDiscrete.super_Policy._m_depth);
    numObvsHistory.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar7] = uVar3;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&fp);
    poVar4 = std::operator<<(poVar4," : ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  local_250 = (ulong)uVar2;
  for (uVar7 = 0; uVar7 != local_250; uVar7 = uVar7 + 1) {
    poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&fp);
    std::endl<char,std::char_traits<char>>(poVar4);
    pPVar1 = (this->_m_indivPols_PolicyPureVector).
             super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7];
    (**(code **)(*(long *)&(pPVar1->super_PolicyDiscretePure).super_PolicyDiscrete.super_Policy +
                0x40))(pPVar1,0);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&fp);
    std::operator<<(poVar4," ");
    iVar5 = -1;
    uVar2 = 1;
    while( true ) {
      if (numObvsHistory.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] <= uVar2) break;
      if ((uVar2 / 0x1e) * 0x1e + iVar5 == 0) {
        std::endl<char,std::char_traits<char>>((ostream *)&fp);
      }
      pPVar1 = (this->_m_indivPols_PolicyPureVector).
               super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7];
      (**(code **)(*(long *)&(pPVar1->super_PolicyDiscretePure).super_PolicyDiscrete.super_Policy +
                  0x40))(pPVar1,uVar2);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&fp);
      std::operator<<(poVar4," ");
      uVar2 = uVar2 + 1;
      iVar5 = iVar5 + -1;
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&numObvsHistory.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::ofstream::~ofstream(&fp);
  return;
}

Assistant:

void JPolComponent_VectorImplementation::ExportPolicyToFile(const std::string& path, const Index& horizon) const {
    ofstream fp(path.c_str());

    // Output horizon
    fp << "Horizon : " << horizon << endl;

    // Get nr agents and output to file
    Index nrAgents = GetInterfacePTPDiscretePure()->GetNrAgents();
    fp << "NrAgents : " << nrAgents << endl;


    vector<Index> numObvsHistory(nrAgents);

    // Get number of observation histories for each agent
    for(Index i=0; i<nrAgents; ++i) {

        numObvsHistory[i] = GetInterfacePTPDiscretePure()->GetNrPolicyDomainElements(
            i, PolicyGlobals::OHIST_INDEX, _m_indivPols_PolicyPureVector[i]->GetDepth());

        fp << i << " : " << numObvsHistory[i] << endl;
    }

    // Output policies for all agents
    for(Index i=0; i<nrAgents; ++i) {

        // Output policy
        fp << endl << endl;

        // Output first action
        fp << _m_indivPols_PolicyPureVector[i]->GetActionIndex(0) << " ";

        // Output rest
        for(Index j=1; j<numObvsHistory[i]; ++j) {

            // Break lines
            if(j % 30 == 0) {
                fp << endl;
            }

            fp << _m_indivPols_PolicyPureVector[i]->GetActionIndex(j) << " ";
        }
    }
}